

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

bool __thiscall capnp::_::PointerReader::isCanonical(PointerReader *this,word **readHead)

{
  WirePointer *pWVar1;
  bool bVar2;
  StructPointerCount SVar3;
  PointerType PVar4;
  StructDataBitCount SVar5;
  WirePointer *pWVar6;
  byte local_b9;
  Fault local_90;
  Fault f;
  undefined1 local_58 [8];
  StructReader structReader;
  bool ptrTrunc;
  bool dataTrunc;
  word **readHead_local;
  PointerReader *this_local;
  
  if (this->pointer == (WirePointer *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = WirePointer::isPositional(this->pointer);
    if (bVar2) {
      PVar4 = getPointerType(this);
      switch(PVar4) {
      case NULL_:
        this_local._7_1_ = true;
        break;
      case STRUCT:
        getStruct((StructReader *)local_58,this,(word *)0x0);
        SVar5 = StructReader::getDataSectionSize((StructReader *)local_58);
        if ((SVar5 == 0) &&
           (SVar3 = StructReader::getPointerSectionSize((StructReader *)local_58), SVar3 == 0)) {
          pWVar1 = this->pointer;
          pWVar6 = (WirePointer *)StructReader::getLocation((StructReader *)local_58);
          this_local._7_1_ = pWVar1 == pWVar6;
        }
        else {
          bVar2 = StructReader::isCanonical
                            ((StructReader *)local_58,readHead,readHead,
                             (bool *)&structReader.field_0x2f,(bool *)&structReader.field_0x2e);
          local_b9 = 0;
          if ((bVar2) && (local_b9 = 0, (structReader._47_1_ & 1) != 0)) {
            local_b9 = structReader._46_1_;
          }
          this_local._7_1_ = (bool)(local_b9 & 1);
        }
        break;
      case LIST:
        getListAnySize((ListReader *)&f,this,(word *)0x0);
        this_local._7_1_ = ListReader::isCanonical((ListReader *)&f,readHead,this->pointer);
        break;
      case CAPABILITY:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                  (&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xae4,FAILED,(char *)0x0,"\"Capabilities are not positional\"",
                   (char (*) [32])"Capabilities are not positional");
        kj::_::Debug::Fault::fatal(&local_90);
      default:
        kj::_::unreachable();
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool PointerReader::isCanonical(const word **readHead) {
  if (!this->pointer) {
    // The pointer is null, so we are canonical and do not read
    return true;
  }

  if (!this->pointer->isPositional()) {
    // The pointer is a FAR or OTHER pointer, and is non-canonical
    return false;
  }

  switch (this->getPointerType()) {
    case PointerType::NULL_:
      // The pointer is null, we are canonical and do not read
      return true;
    case PointerType::STRUCT: {
      bool dataTrunc, ptrTrunc;
      auto structReader = this->getStruct(nullptr);
      if (structReader.getDataSectionSize() == ZERO * BITS &&
          structReader.getPointerSectionSize() == ZERO * POINTERS) {
        return reinterpret_cast<const word*>(this->pointer) == structReader.getLocation();
      } else {
        return structReader.isCanonical(readHead, readHead, &dataTrunc, &ptrTrunc) && dataTrunc && ptrTrunc;
      }
    }
    case PointerType::LIST:
      return this->getListAnySize(nullptr).isCanonical(readHead, pointer);
    case PointerType::CAPABILITY:
      KJ_FAIL_ASSERT("Capabilities are not positional");
  }
  KJ_UNREACHABLE;
}